

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitted_normal_matrix.cc
# Opt level: O0

void __thiscall
ipx::SplittedNormalMatrix::_Apply
          (SplittedNormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  bool bVar1;
  reference piVar2;
  double *pdVar3;
  double *in_RCX;
  valarray<double> *in_RDX;
  SparseMatrix *in_RDI;
  double dVar4;
  Int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Timer timer;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Vector *in_stack_ffffffffffffffb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc0;
  valarray<double> *in_stack_ffffffffffffffc8;
  Vector *y;
  SparseMatrix *A;
  
  Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (valarray<double> *)in_RDI);
  Timer::Reset((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  BackwardSolve((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI
                ,(Vector *)0x85015b);
  dVar4 = Timer::Elapsed((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI[3].values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(dVar4 + (double)in_RDI[3].values_queue_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
  A = (SparseMatrix *)0x0;
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (double *)in_RDI);
  Timer::Reset((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  AddNormalProduct(A,(double *)in_stack_ffffffffffffffc8,
                   (Vector *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  dVar4 = Timer::Elapsed((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(double *)(in_RDI + 4) = dVar4 + *(double *)(in_RDI + 4);
  Timer::Reset((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  ForwardSolve((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,
               (Vector *)0x850202);
  dVar4 = Timer::Elapsed((Timer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI[3].values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(dVar4 + (double)in_RDI[3].values_queue_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
  std::valarray<double>::operator+=((valarray<double> *)A,in_stack_ffffffffffffffc8);
  y = (Vector *)
      &in_RDI[3].colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffc0);
    in_stack_ffffffffffffffb4 = *piVar2;
    pdVar3 = std::valarray<double>::operator[](in_RDX,(long)in_stack_ffffffffffffffb4);
    *pdVar3 = 0.0;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffc0);
  }
  if (in_RCX != (double *)0x0) {
    dVar4 = Dot((Vector *)A,y);
    *in_RCX = dVar4;
  }
  return;
}

Assistant:

void SplittedNormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                                  double* rhs_dot_lhs) {
    assert(prepared_);
    Timer timer;

    // Compute work = inverse(B') * rhs.
    work_ = rhs;
    timer.Reset();
    BackwardSolve(L_, U_, work_);
    time_Bt_ += timer.Elapsed();

    // Compute lhs = N*N' * work.
    lhs = 0.0;
    timer.Reset();
    AddNormalProduct(N_, nullptr, work_, lhs);
    time_NNt_ += timer.Elapsed();

    // Compute lhs := inverse(B) * lhs.
    timer.Reset();
    ForwardSolve(L_, U_, lhs);
    time_B_ += timer.Elapsed();

    lhs += rhs;
    for (Int i : free_positions_)
        lhs[i] = 0.0;
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
}